

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdExtmul<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,wabt::interp::Simd<unsigned_char,(unsigned_char)16>,true>
          (Thread *this)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  unkuint9 Var15;
  undefined1 auVar16 [11];
  undefined1 auVar17 [13];
  undefined1 auVar18 [15];
  unkuint9 Var19;
  undefined1 auVar20 [11];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  ulong uVar25;
  ulong uVar26;
  undefined1 auVar27 [12];
  Value VVar29;
  Value VVar30;
  undefined1 auVar28 [16];
  
  VVar29 = Pop(this);
  uVar25 = VVar29.field_0.i64_;
  VVar30 = Pop(this);
  uVar26 = VVar30.field_0.i64_;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar26;
  auVar2[0xe] = VVar30.field_0._7_1_;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar26;
  auVar4[0xc] = VVar30.field_0._6_1_;
  auVar4._13_2_ = auVar2._13_2_;
  auVar6._8_4_ = 0;
  auVar6._0_8_ = uVar26;
  auVar6._12_3_ = auVar4._12_3_;
  auVar8._8_2_ = 0;
  auVar8._0_8_ = uVar26;
  auVar8[10] = VVar30.field_0._5_1_;
  auVar8._11_4_ = auVar6._11_4_;
  auVar10._8_2_ = 0;
  auVar10._0_8_ = uVar26;
  auVar10._10_5_ = auVar8._10_5_;
  auVar12[8] = VVar30.field_0._4_1_;
  auVar12._0_8_ = uVar26;
  auVar12._9_6_ = auVar10._9_6_;
  auVar14._7_8_ = 0;
  auVar14._0_7_ = auVar12._8_7_;
  Var15 = CONCAT81(SUB158(auVar14 << 0x40,7),VVar30.field_0._3_1_);
  auVar21._9_6_ = 0;
  auVar21._0_9_ = Var15;
  auVar16._1_10_ = SUB1510(auVar21 << 0x30,5);
  auVar16[0] = VVar30.field_0._2_1_;
  auVar22._11_4_ = 0;
  auVar22._0_11_ = auVar16;
  auVar17._1_12_ = SUB1512(auVar22 << 0x20,3);
  auVar17[0] = VVar30.field_0._1_1_;
  auVar1._8_6_ = 0;
  auVar1._0_8_ = uVar25;
  auVar1[0xe] = VVar29.field_0._7_1_;
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar25;
  auVar3[0xc] = VVar29.field_0._6_1_;
  auVar3._13_2_ = auVar1._13_2_;
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar25;
  auVar5._12_3_ = auVar3._12_3_;
  auVar7._8_2_ = 0;
  auVar7._0_8_ = uVar25;
  auVar7[10] = VVar29.field_0._5_1_;
  auVar7._11_4_ = auVar5._11_4_;
  auVar9._8_2_ = 0;
  auVar9._0_8_ = uVar25;
  auVar9._10_5_ = auVar7._10_5_;
  auVar11[8] = VVar29.field_0._4_1_;
  auVar11._0_8_ = uVar25;
  auVar11._9_6_ = auVar9._9_6_;
  auVar18._7_8_ = 0;
  auVar18._0_7_ = auVar11._8_7_;
  Var19 = CONCAT81(SUB158(auVar18 << 0x40,7),VVar29.field_0._3_1_);
  auVar23._9_6_ = 0;
  auVar23._0_9_ = Var19;
  auVar20._1_10_ = SUB1510(auVar23 << 0x30,5);
  auVar20[0] = VVar29.field_0._2_1_;
  auVar24._11_4_ = 0;
  auVar24._0_11_ = auVar20;
  auVar13[2] = VVar29.field_0._1_1_;
  auVar13._0_2_ = VVar29.field_0._0_2_;
  auVar13._3_12_ = SUB1512(auVar24 << 0x20,3);
  auVar27._0_8_ =
       CONCAT26((short)Var19 * (short)Var15,
                CONCAT24(auVar20._0_2_ * auVar16._0_2_,
                         CONCAT22(auVar13._2_2_ * auVar17._0_2_,
                                  (VVar29.field_0._0_2_ & 0xff) * (ushort)VVar30.field_0._0_1_)));
  auVar27._8_2_ = auVar11._8_2_ * auVar12._8_2_;
  auVar27._10_2_ = auVar7._10_2_ * auVar8._10_2_;
  auVar28._12_2_ = auVar3._12_2_ * auVar4._12_2_;
  auVar28._0_12_ = auVar27;
  auVar28._14_2_ = (auVar1._13_2_ >> 8) * (auVar2._13_2_ >> 8);
  VVar29.field_0._12_4_ = auVar28._12_4_;
  VVar29.field_0._8_4_ = auVar27._8_4_;
  VVar29.field_0.i64_ = auVar27._0_8_;
  Push(this,VVar29);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdExtmul() {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  using U = typename S::LaneType;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = (low ? 0 : S::lanes) + i;
    result[i] = U(lhs[laneidx]) * U(rhs[laneidx]);
  }
  Push(result);
  return RunResult::Ok;
}